

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O1

void __thiscall dh::trival::trival(trival *this,string *operand)

{
  trivalitem::trivalitem(&this->_res);
  (this->_operand)._M_dataplus._M_p = (pointer)&(this->_operand).field_2;
  (this->_operand)._M_string_length = 0;
  (this->_operand).field_2._M_local_buf[0] = '\0';
  trivalitem::trivalitem(&this->_val1);
  trivalitem::trivalitem(&this->_val2);
  std::__cxx11::string::_M_assign((string *)&this->_operand);
  this->size = 0;
  return;
}

Assistant:

trival( ::std::string operand)
		{
			this->_operand = operand;
			size = 0;
		}